

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O0

void __thiscall de::SpinBarrier::removeThread(SpinBarrier *this,WaitMode requestedMode)

{
  deInt32 numThreads;
  WaitMode WVar1;
  deInt32 dVar2;
  WaitMode waitMode;
  deInt32 cachedNumThreads;
  WaitMode requestedMode_local;
  SpinBarrier *this_local;
  
  numThreads = this->m_numThreads;
  WVar1 = getWaitMode(requestedMode,this->m_numCores,numThreads);
  if (0 < this->m_numLeaving) {
    while (this->m_numLeaving != 0) {
      wait((void *)(ulong)WVar1);
    }
  }
  ::deAtomicIncrementInt32(&this->m_numRemoved);
  dVar2 = ::deAtomicIncrementInt32(&this->m_numEntered);
  if (dVar2 == numThreads) {
    this->m_numThreads = this->m_numThreads - this->m_numRemoved;
    this->m_numLeaving = this->m_numThreads;
    this->m_numRemoved = 0;
    deMemoryReadWriteFence();
    this->m_numEntered = 0;
  }
  return;
}

Assistant:

void SpinBarrier::removeThread (WaitMode requestedMode)
{
	const deInt32	cachedNumThreads	= m_numThreads;
	const WaitMode	waitMode			= getWaitMode(requestedMode, m_numCores, cachedNumThreads);

	// Wait for other threads exiting previous barrier
	if (m_numLeaving > 0)
	{
		for (;;)
		{
			if (m_numLeaving == 0)
				break;

			wait(waitMode);
		}
	}

	// Ask for last thread entering barrier to adjust thread count
	deAtomicIncrement32(&m_numRemoved);

	// See sync() - use cached value
	if (deAtomicIncrement32(&m_numEntered) == cachedNumThreads)
	{
		// Release all waiting threads.
		m_numThreads -= m_numRemoved;
		m_numLeaving  = m_numThreads;
		m_numRemoved  = 0;

		deMemoryReadWriteFence();
		m_numEntered  = 0;
	}
}